

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O2

LispPTR * N_OP_bind(LispPTR *stack_pointer,LispPTR tos,uint byte1,uint byte2)

{
  LispPTR *pLVar1;
  uint uVar2;
  LispPTR *pLVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = byte1 >> 4;
  pLVar1 = (LispPTR *)(MachineState.pvar + (ulong)byte2 * 2);
  while( true ) {
    pLVar3 = pLVar1 + -1;
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) break;
    *pLVar1 = 0;
    pLVar1 = pLVar3;
  }
  uVar4 = byte1 & 0xf;
  if (uVar4 == 0) {
    *stack_pointer = tos;
    stack_pointer = stack_pointer + 1;
  }
  else {
    *pLVar1 = tos;
    uVar2 = uVar4;
    while (uVar2 = uVar2 - 1, uVar2 != 0) {
      pLVar1 = stack_pointer + -1;
      stack_pointer = stack_pointer + -1;
      *pLVar3 = *pLVar1;
      pLVar3 = pLVar3 + -1;
    }
  }
  *stack_pointer = byte2 * 2 | ~((byte1 >> 4) + uVar4) << 0x10;
  return stack_pointer;
}

Assistant:

LispPTR *N_OP_bind(LispPTR *stack_pointer, LispPTR tos, unsigned byte1, unsigned byte2) {
  unsigned n1;         /* # slots to bind to NIL (0, 0) */
  unsigned n2;         /* # slots to bind to value in stack */
  LispPTR *ppvar; /* pointer to argued slot in Pvar area */
  unsigned i;          /* temporary for control */

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_bind()\n");
#endif

  n1 = byte1 >> 4;
  n2 = byte1 & 0xf;
  ppvar = (LispPTR *)PVar + 1 + byte2;

  for (i = 0; i < n1; i++) { *--ppvar = NIL_PTR; }

  if (n2 == 0) {
    *stack_pointer++ = tos; /* push TopOfStack to Evaluation stack */
  } else {
    *--ppvar = tos; /* bind to TopOfStack */
    for (i = 1; i < n2; i++) { *--ppvar = *(--stack_pointer); }
  }

  i = ~(n1 + n2); /* x: 1's complement of number of bind slots */
  *stack_pointer = (i << 16) | (byte2 << 1);
  return (stack_pointer);
}